

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QList<QString> * __thiscall QSet<QString>::values(QSet<QString> *this)

{
  long lVar1;
  bool bVar2;
  QSet<QString> *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  QList<QString> *result;
  const_iterator i;
  QList<QString> *this_00;
  QList<QString> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x14fe70);
  size((QSet<QString> *)0x14fe7a);
  QList<QString>::reserve(in_stack_ffffffffffffffd8,in_stack_00000018);
  constBegin(in_RSI);
  while( true ) {
    constEnd(in_RSI);
    bVar2 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI);
    if (!bVar2) break;
    const_iterator::operator*((const_iterator *)0x14fedc);
    QList<QString>::append(this_00,(parameter_type)in_RDI);
    const_iterator::operator++((const_iterator *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}